

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

int hash_insert(HashTable *table,void *key,void *value)

{
  uint32 uVar1;
  int iVar2;
  HashItem *pHVar3;
  uint32 hash;
  HashItem *item;
  void *value_local;
  void *key_local;
  HashTable *table_local;
  
  uVar1 = calc_hash(table,key);
  if ((table->stackable == 0) && (iVar2 = hash_find(table,key,(void **)0x0), iVar2 != 0)) {
    return 0;
  }
  pHVar3 = (HashItem *)(*table->m)(0x18,table->d);
  if (pHVar3 == (HashItem *)0x0) {
    table_local._4_4_ = -1;
  }
  else {
    pHVar3->key = key;
    pHVar3->value = value;
    pHVar3->next = table->table[uVar1];
    table->table[uVar1] = pHVar3;
    table_local._4_4_ = 1;
  }
  return table_local._4_4_;
}

Assistant:

int hash_insert(HashTable *table, const void *key, const void *value)
{
    HashItem *item = NULL;
    const uint32 hash = calc_hash(table, key);
    if ( (!table->stackable) && (hash_find(table, key, NULL)) )
        return 0;

    // !!! FIXME: grow and rehash table if it gets too saturated.
    item = (HashItem *) table->m(sizeof (HashItem), table->d);
    if (item == NULL)
        return -1;

    item->key = key;
    item->value = value;
    item->next = table->table[hash];
    table->table[hash] = item;

    return 1;
}